

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

StructType * __thiscall deqp::gls::ub::ShaderInterface::findStruct(ShaderInterface *this,char *name)

{
  bool bVar1;
  reference ppSVar2;
  StructType *local_88;
  __normal_iterator<deqp::gls::ub::StructType_*const_*,_std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>_>
  local_68 [3];
  StructNameEquals local_50;
  __normal_iterator<deqp::gls::ub::StructType_*const_*,_std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>_>
  local_30;
  __normal_iterator<deqp::gls::ub::StructType_*const_*,_std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>_>
  local_28;
  __normal_iterator<deqp::gls::ub::StructType_*const_*,_std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>_>
  local_20;
  const_iterator pos;
  char *name_local;
  ShaderInterface *this_local;
  
  pos._M_current = (StructType **)name;
  local_28._M_current =
       (StructType **)
       std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::begin
                 (&this->m_structs);
  local_30._M_current =
       (StructType **)
       std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::end
                 (&this->m_structs);
  StructNameEquals::StructNameEquals(&local_50,(char *)pos._M_current);
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<deqp::gls::ub::StructType*const*,std::vector<deqp::gls::ub::StructType*,std::allocator<deqp::gls::ub::StructType*>>>,deqp::gls::ub::StructNameEquals>
                       (local_28,local_30,&local_50);
  StructNameEquals::~StructNameEquals(&local_50);
  local_68[0]._M_current =
       (StructType **)
       std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::end
                 (&this->m_structs);
  bVar1 = __gnu_cxx::operator!=(&local_20,local_68);
  if (bVar1) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<deqp::gls::ub::StructType_*const_*,_std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>_>
              ::operator*(&local_20);
    local_88 = *ppSVar2;
  }
  else {
    local_88 = (StructType *)0x0;
  }
  return local_88;
}

Assistant:

const StructType* ShaderInterface::findStruct (const char* name) const
{
	std::vector<StructType*>::const_iterator pos = std::find_if(m_structs.begin(), m_structs.end(), StructNameEquals(name));
	return pos != m_structs.end() ? *pos : DE_NULL;
}